

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_txn_state(sqlite3 *db,char *zSchema)

{
  Btree *p;
  int local_38;
  int x;
  Btree *pBt;
  int local_20;
  int iTxn;
  int nDb;
  int iDb;
  char *zSchema_local;
  sqlite3 *db_local;
  
  pBt._4_4_ = -1;
  sqlite3_mutex_enter(db->mutex);
  if (zSchema == (char *)0x0) {
    iTxn = 0;
    local_20 = db->nDb + -1;
  }
  else {
    iTxn = sqlite3FindDbName(db,zSchema);
    local_20 = iTxn;
    if (iTxn < 0) {
      local_20 = iTxn + -1;
    }
  }
  for (; iTxn <= local_20; iTxn = iTxn + 1) {
    p = db->aDb[iTxn].pBt;
    if (p == (Btree *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = sqlite3BtreeTxnState(p);
    }
    if (pBt._4_4_ < local_38) {
      pBt._4_4_ = local_38;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return pBt._4_4_;
}

Assistant:

SQLITE_API int sqlite3_txn_state(sqlite3 *db, const char *zSchema){
  int iDb, nDb;
  int iTxn = -1;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return -1;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  if( zSchema ){
    nDb = iDb = sqlite3FindDbName(db, zSchema);
    if( iDb<0 ) nDb--;
  }else{
    iDb = 0;
    nDb = db->nDb-1;
  }
  for(; iDb<=nDb; iDb++){
    Btree *pBt = db->aDb[iDb].pBt;
    int x = pBt!=0 ? sqlite3BtreeTxnState(pBt) : SQLITE_TXN_NONE;
    if( x>iTxn ) iTxn = x;
  }
  sqlite3_mutex_leave(db->mutex);
  return iTxn;
}